

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O3

long __thiscall
mkvparser::Cluster::CreateBlock
          (Cluster *this,longlong id,longlong pos,longlong size,longlong discard_padding)

{
  ulong uVar1;
  ulong uVar2;
  BlockEntry **ppBVar3;
  long lVar4;
  BlockEntry **ppBVar5;
  
  if ((id != 0xa3) && (id != 0xa0)) {
    return -1;
  }
  ppBVar5 = this->m_entries;
  uVar1 = this->m_entries_count;
  if ((long)uVar1 < 0) {
    if (ppBVar5 != (BlockEntry **)0x0) {
      __assert_fail("m_entries == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                    ,0x1be6,
                    "long mkvparser::Cluster::CreateBlock(long long, long long, long long, long long)"
                   );
    }
    if (this->m_entries_size != 0) {
      __assert_fail("m_entries_size == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                    ,0x1be7,
                    "long mkvparser::Cluster::CreateBlock(long long, long long, long long, long long)"
                   );
    }
    this->m_entries_size = 0x400;
    ppBVar5 = (BlockEntry **)operator_new__(0x2000,(nothrow_t *)&std::nothrow);
    this->m_entries = ppBVar5;
    if (ppBVar5 == (BlockEntry **)0x0) {
      return -1;
    }
    this->m_entries_count = 0;
  }
  else {
    if (ppBVar5 == (BlockEntry **)0x0) {
      __assert_fail("m_entries",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                    ,0x1bf0,
                    "long mkvparser::Cluster::CreateBlock(long long, long long, long long, long long)"
                   );
    }
    uVar2 = this->m_entries_size;
    if ((long)uVar2 < 1) {
      __assert_fail("m_entries_size > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                    ,0x1bf1,
                    "long mkvparser::Cluster::CreateBlock(long long, long long, long long, long long)"
                   );
    }
    if (uVar2 < uVar1) {
      __assert_fail("m_entries_count <= m_entries_size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                    ,0x1bf2,
                    "long mkvparser::Cluster::CreateBlock(long long, long long, long long, long long)"
                   );
    }
    if (uVar2 <= uVar1) {
      ppBVar3 = (BlockEntry **)
                operator_new__(-(ulong)(uVar2 >> 0x3c != 0) | uVar2 << 4,(nothrow_t *)&std::nothrow)
      ;
      if (ppBVar3 == (BlockEntry **)0x0) {
        return -1;
      }
      lVar4 = 0;
      do {
        *(undefined8 *)((long)ppBVar3 + lVar4) = *(undefined8 *)((long)ppBVar5 + lVar4);
        lVar4 = lVar4 + 8;
      } while (uVar1 << 3 != lVar4);
      operator_delete__(ppBVar5);
      this->m_entries = ppBVar3;
      this->m_entries_size = uVar2 * 2;
    }
  }
  if (id != 0xa0) {
    lVar4 = CreateSimpleBlock(this,pos,size);
    return lVar4;
  }
  lVar4 = CreateBlockGroup(this,pos,size,discard_padding);
  return lVar4;
}

Assistant:

long Cluster::CreateBlock(long long id,
                          long long pos,  // absolute pos of payload
                          long long size, long long discard_padding) {
  if (id != libwebm::kMkvBlockGroup && id != libwebm::kMkvSimpleBlock)
    return E_PARSE_FAILED;

  if (m_entries_count < 0) {  // haven't parsed anything yet
    assert(m_entries == NULL);
    assert(m_entries_size == 0);

    m_entries_size = 1024;
    m_entries = new (std::nothrow) BlockEntry*[m_entries_size];
    if (m_entries == NULL)
      return -1;

    m_entries_count = 0;
  } else {
    assert(m_entries);
    assert(m_entries_size > 0);
    assert(m_entries_count <= m_entries_size);

    if (m_entries_count >= m_entries_size) {
      const long entries_size = 2 * m_entries_size;

      BlockEntry** const entries = new (std::nothrow) BlockEntry*[entries_size];
      if (entries == NULL)
        return -1;

      BlockEntry** src = m_entries;
      BlockEntry** const src_end = src + m_entries_count;

      BlockEntry** dst = entries;

      while (src != src_end)
        *dst++ = *src++;

      delete[] m_entries;

      m_entries = entries;
      m_entries_size = entries_size;
    }
  }

  if (id == libwebm::kMkvBlockGroup)
    return CreateBlockGroup(pos, size, discard_padding);
  else
    return CreateSimpleBlock(pos, size);
}